

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O1

int resampler_basic_zero
              (SpeexResamplerState *st,uint channel_index,spx_word16_t *in,uint *in_len,
              spx_word16_t *out,uint *out_len)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  uint *puVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  
  piVar6 = st->last_sample;
  iVar10 = piVar6[channel_index];
  puVar7 = st->samp_frac_num;
  uVar9 = puVar7[channel_index];
  uVar1 = *in_len;
  uVar8 = 0;
  if (iVar10 < (int)uVar1) {
    uVar2 = st->den_rate;
    iVar3 = st->int_advance;
    iVar4 = st->frac_advance;
    iVar5 = st->out_stride;
    uVar8 = (ulong)*out_len;
    if ((int)*out_len < 1) {
      uVar8 = 0;
    }
    uVar11 = 0;
    do {
      if (uVar8 == uVar11) goto LAB_0011763c;
      uVar11 = uVar11 + 1;
      uVar9 = uVar9 + iVar4;
      uVar12 = 0;
      if (uVar9 >= uVar2) {
        uVar12 = uVar2;
      }
      iVar10 = (iVar10 + iVar3 + 1) - (uint)(uVar9 < uVar2);
      *out = 0.0;
      uVar9 = uVar9 - uVar12;
      out = out + iVar5;
    } while (iVar10 < (int)uVar1);
    uVar8 = uVar11 & 0xffffffff;
  }
LAB_0011763c:
  piVar6[channel_index] = iVar10;
  puVar7[channel_index] = uVar9;
  return (int)uVar8;
}

Assistant:

static int resampler_basic_zero(SpeexResamplerState *st, spx_uint32_t channel_index, const spx_word16_t *in, spx_uint32_t *in_len, spx_word16_t *out, spx_uint32_t *out_len)
{
   int out_sample = 0;
   int last_sample = st->last_sample[channel_index];
   spx_uint32_t samp_frac_num = st->samp_frac_num[channel_index];
   const int out_stride = st->out_stride;
   const int int_advance = st->int_advance;
   const int frac_advance = st->frac_advance;
   const spx_uint32_t den_rate = st->den_rate;

   while (!(last_sample >= (spx_int32_t)*in_len || out_sample >= (spx_int32_t)*out_len))
   {
      out[out_stride * out_sample++] = 0;
      last_sample += int_advance;
      samp_frac_num += frac_advance;
      if (samp_frac_num >= den_rate)
      {
         samp_frac_num -= den_rate;
         last_sample++;
      }
   }

   st->last_sample[channel_index] = last_sample;
   st->samp_frac_num[channel_index] = samp_frac_num;
   return out_sample;
}